

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseMessageSetItem
          (ExtensionSet *this,CodedInputStream *input,ExtensionFinder *extension_finder,
          FieldSkipper *field_skipper)

{
  bool bVar1;
  uint32 uVar2;
  int size;
  uint uVar3;
  ulong uVar4;
  uint8 *buffer;
  undefined1 local_130 [8];
  CodedOutputStream coded_output;
  StringOutputStream output_stream;
  undefined1 local_f8 [4];
  uint32 length;
  string temp;
  CodedInputStream sub_input;
  uint32 type_id;
  undefined1 local_68 [4];
  uint32 tag;
  string message_data;
  uint32 fake_tag;
  FieldSkipper *field_skipper_local;
  ExtensionFinder *extension_finder_local;
  CodedInputStream *input_local;
  ExtensionSet *this_local;
  uint local_c;
  
  message_data.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)local_68);
  do {
    do {
      while( true ) {
        if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ < 0x80)) {
          input->last_tag_ = (uint)*input->buffer_;
          io::CodedInputStream::Advance(input,1);
          local_c = input->last_tag_;
        }
        else {
          uVar2 = io::CodedInputStream::ReadTagFallback(input);
          input->last_tag_ = uVar2;
          local_c = input->last_tag_;
        }
        if (local_c == 0) {
          this_local._7_1_ = 0;
          goto LAB_0033e544;
        }
        if (local_c == 0xc) {
          this_local._7_1_ = 1;
          goto LAB_0033e544;
        }
        if (local_c == 0x10) break;
        if (local_c == 0x1a) {
          if (message_data.field_2._12_4_ == 0) {
            std::__cxx11::string::string((string *)local_f8);
            bVar1 = io::CodedInputStream::ReadVarint32
                              (input,(uint32 *)((long)&output_stream.target_ + 4));
            if (bVar1) {
              bVar1 = io::CodedInputStream::ReadString
                                (input,(string *)local_f8,output_stream.target_._4_4_);
              if (bVar1) {
                io::StringOutputStream::StringOutputStream
                          ((StringOutputStream *)&coded_output.had_error_,(string *)local_68);
                io::CodedOutputStream::CodedOutputStream
                          ((CodedOutputStream *)local_130,
                           (ZeroCopyOutputStream *)&coded_output.had_error_);
                io::CodedOutputStream::WriteVarint32
                          ((CodedOutputStream *)local_130,output_stream.target_._4_4_);
                io::CodedOutputStream::WriteString
                          ((CodedOutputStream *)local_130,(string *)local_f8);
                io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_130);
                io::StringOutputStream::~StringOutputStream
                          ((StringOutputStream *)&coded_output.had_error_);
                bVar1 = false;
              }
              else {
                this_local._7_1_ = 0;
                bVar1 = true;
              }
            }
            else {
              this_local._7_1_ = 0;
              bVar1 = true;
            }
            std::__cxx11::string::~string((string *)local_f8);
            if (bVar1) goto LAB_0033e544;
          }
          else {
            bVar1 = ParseFieldMaybeLazily
                              (this,message_data.field_2._12_4_,input,extension_finder,field_skipper
                              );
            if (!bVar1) {
              this_local._7_1_ = 0;
              goto LAB_0033e544;
            }
          }
        }
        else {
          uVar3 = (*field_skipper->_vptr_FieldSkipper[2])(field_skipper,input,(ulong)local_c);
          if ((uVar3 & 1) == 0) {
            this_local._7_1_ = 0;
            goto LAB_0033e544;
          }
        }
      }
      bVar1 = io::CodedInputStream::ReadVarint32
                        (input,(uint32 *)((long)&sub_input.extension_factory_ + 4));
      if (!bVar1) {
        this_local._7_1_ = 0;
        goto LAB_0033e544;
      }
      message_data.field_2._12_4_ =
           WireFormatLite::MakeTag(sub_input.extension_factory_._4_4_,WIRETYPE_LENGTH_DELIMITED);
      uVar4 = std::__cxx11::string::empty();
    } while ((uVar4 & 1) != 0);
    buffer = (uint8 *)std::__cxx11::string::data();
    size = std::__cxx11::string::size();
    io::CodedInputStream::CodedInputStream
              ((CodedInputStream *)((long)&temp.field_2 + 8),buffer,size);
    bVar1 = ParseFieldMaybeLazily
                      (this,message_data.field_2._12_4_,
                       (CodedInputStream *)((long)&temp.field_2 + 8),extension_finder,field_skipper)
    ;
    if (bVar1) {
      std::__cxx11::string::clear();
    }
    else {
      this_local._7_1_ = 0;
    }
    io::CodedInputStream::~CodedInputStream((CodedInputStream *)((long)&temp.field_2 + 8));
  } while (bVar1);
LAB_0033e544:
  std::__cxx11::string::~string((string *)local_68);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ExtensionSet::ParseMessageSetItem(io::CodedInputStream* input,
                                       ExtensionFinder* extension_finder,
                                       FieldSkipper* field_skipper) {
  // TODO(kenton):  It would be nice to share code between this and
  // WireFormatLite::ParseAndMergeMessageSetItem(), but I think the
  // differences would be hard to factor out.

  // This method parses a group which should contain two fields:
  //   required int32 type_id = 2;
  //   required data message = 3;

  // Once we see a type_id, we'll construct a fake tag for this extension
  // which is the tag it would have had under the proto2 extensions wire
  // format.
  uint32 fake_tag = 0;

  // If we see message data before the type_id, we'll append it to this so
  // we can parse it later.
  string message_data;

  while (true) {
    uint32 tag = input->ReadTag();
    if (tag == 0) return false;

    switch (tag) {
      case WireFormatLite::kMessageSetTypeIdTag: {
        uint32 type_id;
        if (!input->ReadVarint32(&type_id)) return false;
        fake_tag = WireFormatLite::MakeTag(type_id,
            WireFormatLite::WIRETYPE_LENGTH_DELIMITED);

        if (!message_data.empty()) {
          // We saw some message data before the type_id.  Have to parse it
          // now.
          io::CodedInputStream sub_input(
              reinterpret_cast<const uint8*>(message_data.data()),
              message_data.size());
          if (!ParseFieldMaybeLazily(fake_tag, &sub_input,
                                     extension_finder, field_skipper)) {
            return false;
          }
          message_data.clear();
        }

        break;
      }

      case WireFormatLite::kMessageSetMessageTag: {
        if (fake_tag == 0) {
          // We haven't seen a type_id yet.  Append this data to message_data.
          string temp;
          uint32 length;
          if (!input->ReadVarint32(&length)) return false;
          if (!input->ReadString(&temp, length)) return false;
          io::StringOutputStream output_stream(&message_data);
          io::CodedOutputStream coded_output(&output_stream);
          coded_output.WriteVarint32(length);
          coded_output.WriteString(temp);
        } else {
          // Already saw type_id, so we can parse this directly.
          if (!ParseFieldMaybeLazily(fake_tag, input,
                                     extension_finder, field_skipper)) {
            return false;
          }
        }

        break;
      }

      case WireFormatLite::kMessageSetItemEndTag: {
        return true;
      }

      default: {
        if (!field_skipper->SkipField(input, tag)) return false;
      }
    }
  }
}